

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O2

void on_session_state_changed
               (void *context,SESSION_STATE new_session_state,SESSION_STATE previous_session_state)

{
  int iVar1;
  role in_CL;
  undefined4 uStack_20;
  
  if (new_session_state == SESSION_STATE_ERROR) {
    remove_all_pending_deliveries((LINK_INSTANCE *)context,true);
    uStack_20 = LINK_STATE_ERROR;
  }
  else if (new_session_state == SESSION_STATE_DISCARDING) {
    remove_all_pending_deliveries((LINK_INSTANCE *)context,true);
    uStack_20 = LINK_STATE_DETACHED;
  }
  else {
    if ((((new_session_state != SESSION_STATE_MAPPED) || (*(int *)((long)context + 8) != 1)) ||
        (*(char *)((long)context + 0x99) != '\0')) ||
       (iVar1 = send_attach((LINK_INSTANCE *)context,*(char **)((long)context + 0x30),
                            (uint)*(byte *)((long)context + 0x44),in_CL), iVar1 != 0)) {
      return;
    }
    uStack_20 = LINK_STATE_HALF_ATTACHED_ATTACH_SENT;
  }
  set_link_state((LINK_INSTANCE *)context,uStack_20);
  return;
}

Assistant:

static void on_session_state_changed(void* context, SESSION_STATE new_session_state, SESSION_STATE previous_session_state)
{
    LINK_INSTANCE* link_instance = (LINK_INSTANCE*)context;
    (void)previous_session_state;

    if (new_session_state == SESSION_STATE_MAPPED)
    {
        if ((link_instance->link_state == LINK_STATE_DETACHED) && (!link_instance->is_closed))
        {
            if (send_attach(link_instance, link_instance->name, 0, link_instance->role) == 0)
            {
                set_link_state(link_instance, LINK_STATE_HALF_ATTACHED_ATTACH_SENT);
            }
        }
    }
    else if (new_session_state == SESSION_STATE_DISCARDING)
    {
        remove_all_pending_deliveries(link_instance, true);
        set_link_state(link_instance, LINK_STATE_DETACHED);
    }
    else if (new_session_state == SESSION_STATE_ERROR)
    {
        remove_all_pending_deliveries(link_instance, true);
        set_link_state(link_instance, LINK_STATE_ERROR);
    }
}